

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int32 bio_fread_2d(void ***arr,size_t e_sz,uint32 *d1,uint32 *d2,FILE *fp,uint32 swap,uint32 *chksum
                  )

{
  int32 iVar1;
  void *pvVar2;
  void *local_58;
  void *raw;
  size_t ret;
  uint32 n;
  uint32 l_d2;
  uint32 l_d1;
  uint32 swap_local;
  FILE *fp_local;
  uint32 *d2_local;
  uint32 *d1_local;
  size_t e_sz_local;
  void ***arr_local;
  
  l_d2 = swap;
  _l_d1 = fp;
  fp_local = (FILE *)d2;
  d2_local = d1;
  d1_local = (uint32 *)e_sz;
  e_sz_local = (size_t)arr;
  iVar1 = bio_fread(&n,4,1,fp,swap,chksum);
  raw = (void *)(long)iVar1;
  if (raw == (void *)0x1) {
    iVar1 = bio_fread((void *)((long)&ret + 4),4,1,_l_d1,l_d2,chksum);
    raw = (void *)(long)iVar1;
    if (raw == (void *)0x1) {
      iVar1 = bio_fread_1d(&local_58,(size_t)d1_local,(uint32 *)&ret,_l_d1,l_d2,chksum);
      if (iVar1 == (int)ret) {
        if ((int)ret != n * ret._4_4_) {
          __assert_fail("n == l_d1*l_d2",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                        ,0x1a4,
                        "int32 bio_fread_2d(void ***, size_t, uint32 *, uint32 *, FILE *, uint32, uint32 *)"
                       );
        }
        *d2_local = n;
        fp_local->_flags = ret._4_4_;
        pvVar2 = __ckd_alloc_2d_ptr((ulong)n,(ulong)ret._4_4_,local_58,(size_t)d1_local,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                                    ,0x1a8);
        *(void **)e_sz_local = pvVar2;
        arr_local._4_4_ = (int)ret;
      }
      else {
        arr_local._4_4_ = -1;
      }
    }
    else {
      if (raw == (void *)0x0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                       ,0x19a,"Unable to read complete data");
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                       ,0x19d,"OS error in bio_fread_2d");
      }
      arr_local._4_4_ = -1;
    }
  }
  else {
    if (raw == (void *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                     ,400,"Unable to read complete data");
    }
    else {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                     ,0x193,"OS error in bio_fread_2d");
    }
    arr_local._4_4_ = -1;
  }
  return arr_local._4_4_;
}

Assistant:

int32
bio_fread_2d(void ***arr,
             size_t e_sz,
             uint32 *d1,
             uint32 *d2,
             FILE *fp,
             uint32 swap,
             uint32 *chksum)
{
    uint32 l_d1, l_d2;
    uint32 n;
    size_t ret;
    void *raw;
    
    ret = bio_fread(&l_d1, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_2d");
	}
	return -1;
    }
    ret = bio_fread(&l_d2, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_2d");
	}
	return -1;
    }
    if (bio_fread_1d(&raw, e_sz, &n, fp, swap, chksum) != n)
	return -1;

    assert(n == l_d1*l_d2);

    *d1 = l_d1;
    *d2 = l_d2;
    *arr = ckd_alloc_2d_ptr(l_d1, l_d2, raw, e_sz);

    return n;
}